

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isLocalVariableDeclaration(Parser *this)

{
  bool bVar1;
  undefined8 in_RDI;
  Token TVar2;
  TokenKind next;
  TokenKind kind;
  uint32_t index;
  bool local_81;
  uint32_t offset;
  undefined6 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8e;
  TokenKind TVar3;
  undefined1 in_stack_ffffffffffffff90 [16];
  undefined1 in_stack_ffffffffffffffa0 [16];
  TokenKind local_50;
  TokenKind local_40;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  bool local_1;
  
  offset = (uint32_t)((ulong)in_RDI >> 0x20);
  TVar2 = ParserBase::peek((ParserBase *)
                           CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88),offset);
  TVar3 = TVar2.kind;
  if ((TVar3 == BitKeyword) || (TVar3 == ByteKeyword)) {
LAB_0069d551:
    TVar2 = ParserBase::peek((ParserBase *)CONCAT26(TVar3,in_stack_ffffffffffffff88),offset);
    local_40 = TVar2.kind;
    local_81 = local_40 != Apostrophe && local_40 != ApostropheOpenBrace;
    local_1 = local_81;
  }
  else {
    if ((TVar3 != CHandleKeyword) && (1 < (ushort)(TVar3 - EnumKeyword))) {
      if ((((((ushort)(TVar3 - IntKeyword) < 2) || ((ushort)(TVar3 - LogicKeyword) < 2)) ||
           ((ushort)(TVar3 - RealKeyword) < 2)) ||
          ((TVar3 == RegKeyword || ((ushort)(TVar3 - ShortIntKeyword) < 2)))) ||
         (TVar3 == StringKeyword)) goto LAB_0069d551;
      if (TVar3 != StructKeyword) {
        if (TVar3 == TimeKeyword) goto LAB_0069d551;
        if (TVar3 == TypeKeyword) {
          TVar2 = ParserBase::peek((ParserBase *)CONCAT26(0x138,in_stack_ffffffffffffff88),offset);
          local_50 = TVar2.kind;
          if (local_50 != OpenParenthesis) {
            return false;
          }
          bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                            (in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_,
                             in_stack_ffffffffffffff90._14_2_,in_stack_ffffffffffffff90._12_2_);
          if (!bVar1) {
            return false;
          }
          TVar2 = ParserBase::peek((ParserBase *)CONCAT26(TVar3,in_stack_ffffffffffffff88),offset);
          return TVar2.kind == Identifier;
        }
        if (((TVar3 != UnionKeyword) && (TVar3 != VarKeyword)) && (TVar3 != VirtualKeyword)) {
          bVar1 = scanQualifiedName(TVar2._0_8_,
                                    (uint32_t *)
                                    CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                                    local_40._15_1_);
          if (!bVar1) {
            return false;
          }
          bVar1 = scanDimensionList(in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_)
          ;
          if (!bVar1) {
            return false;
          }
          TVar2 = ParserBase::peek((ParserBase *)CONCAT26(TVar3,in_stack_ffffffffffffff88),offset);
          return TVar2.kind == Identifier;
        }
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Parser::isLocalVariableDeclaration() {
    uint32_t index = 0;
    auto kind = peek(index).kind;
    switch (kind) {
        case TokenKind::VarKeyword:
        case TokenKind::CHandleKeyword:
        case TokenKind::EventKeyword:
        case TokenKind::StructKeyword:
        case TokenKind::UnionKeyword:
        case TokenKind::EnumKeyword:
        case TokenKind::VirtualKeyword:
            return true;

        // some cases might be a cast expression
        case TokenKind::StringKeyword:
        case TokenKind::BitKeyword:
        case TokenKind::LogicKeyword:
        case TokenKind::RegKeyword:
        case TokenKind::ByteKeyword:
        case TokenKind::ShortIntKeyword:
        case TokenKind::IntKeyword:
        case TokenKind::LongIntKeyword:
        case TokenKind::IntegerKeyword:
        case TokenKind::TimeKeyword:
        case TokenKind::ShortRealKeyword:
        case TokenKind::RealKeyword:
        case TokenKind::RealTimeKeyword: {
            auto next = peek(++index).kind;
            return next != TokenKind::Apostrophe && next != TokenKind::ApostropheOpenBrace;
        }

        // if this is the type operator it's technically not allowed to be a variable
        // declaration without a "var" prefix, but we'll try to allow it anyway and
        // diagnose it later with a better error message.
        case TokenKind::TypeKeyword: {
            if (peek(++index).kind != TokenKind::OpenParenthesis)
                return false;

            index++;
            if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                           TokenKind::CloseParenthesis)) {
                return false;
            }
            return peek(index).kind == TokenKind::Identifier;
        }

        default:
            break;
    }

    if (!scanQualifiedName(index, /* allowNew */ false))
        return false;

    // might be a list of dimensions here
    if (!scanDimensionList(index))
        return false;

    // next token is the decider; declarations must have an identifier here
    return peek(index).kind == TokenKind::Identifier;
}